

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::test_float_as_real(void)

{
  char *pcVar1;
  float fVar2;
  float local_15c;
  undefined1 local_158 [28];
  float local_13c;
  type_conflict9 local_138 [2];
  float local_128;
  type_conflict8 local_124 [2];
  float local_11c;
  undefined1 local_118 [20];
  float local_104;
  type_conflict9 local_100;
  float local_f4;
  type_conflict8 local_f0 [2];
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  longdouble local_b8;
  undefined1 local_a8 [32];
  double local_88;
  type_conflict9 local_80 [2];
  undefined8 local_70;
  type_conflict9 local_68;
  float local_5c;
  type_conflict8 local_58 [2];
  undefined4 local_50 [4];
  type_conflict8 local_40 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_38,0.0);
  local_40[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_50[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","0.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1600,"void value_suite::test_float_as_real()",local_40,local_50);
  local_58[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_5c = trial::dynamic::basic_variable::operator_cast_to_float((basic_variable *)local_38);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","float(data)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1601,"void value_suite::test_float_as_real()",local_58,&local_5c);
  local_68 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                       ((basic_variable<std::allocator<char>_> *)local_38);
  local_70 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","0.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1602,"void value_suite::test_float_as_real()",&local_68,&local_70);
  local_80[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_88 = trial::dynamic::basic_variable::operator_cast_to_double((basic_variable *)local_38);
  pcVar1 = "double(data)";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("data.value<double>()","double(data)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1603,"void value_suite::test_float_as_real()",local_80,&local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_38,(basic_variable<std::allocator<char>_> *)pcVar1);
  local_b8 = (longdouble)0;
  pcVar1 = "0.0L";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.value<long double>()","0.0L",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1604,"void value_suite::test_float_as_real()",local_a8,&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_38,(basic_variable<std::allocator<char>_> *)pcVar1);
  trial::dynamic::basic_variable::operator_cast_to_long_double
            ((longdouble *)local_38,(basic_variable *)pcVar1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("data.value<long double>()","(long double)(data)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1605,"void value_suite::test_float_as_real()",local_d8,local_e8);
  fVar2 = std::numeric_limits<float>::min();
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_38,fVar2);
  local_f0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_f4 = std::numeric_limits<float>::min();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","std::numeric_limits<float>::min()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1608,"void value_suite::test_float_as_real()",local_f0,&local_f4);
  local_100 = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                        ((basic_variable<std::allocator<char>_> *)local_38);
  local_104 = std::numeric_limits<float>::min();
  pcVar1 = "std::numeric_limits<float>::min()";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,float>
            ("data.value<double>()","std::numeric_limits<float>::min()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1609,"void value_suite::test_float_as_real()",&local_100,&local_104);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_38,(basic_variable<std::allocator<char>_> *)pcVar1);
  local_11c = std::numeric_limits<float>::min();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,float>
            ("data.value<long double>()","std::numeric_limits<float>::min()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x160a,"void value_suite::test_float_as_real()",local_118,&local_11c);
  fVar2 = std::numeric_limits<float>::max();
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_38,fVar2);
  local_124[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                           ((basic_variable<std::allocator<char>_> *)local_38);
  local_128 = std::numeric_limits<float>::max();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("data.value<float>()","std::numeric_limits<float>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x160d,"void value_suite::test_float_as_real()",local_124,&local_128);
  local_138[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                           ((basic_variable<std::allocator<char>_> *)local_38);
  local_13c = std::numeric_limits<float>::max();
  pcVar1 = "std::numeric_limits<float>::max()";
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,float>
            ("data.value<double>()","std::numeric_limits<float>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x160e,"void value_suite::test_float_as_real()",local_138,&local_13c);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<long_double>
            ((type_conflict10 *)local_38,(basic_variable<std::allocator<char>_> *)pcVar1);
  local_15c = std::numeric_limits<float>::max();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,float>
            ("data.value<long double>()","std::numeric_limits<float>::max()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x160f,"void value_suite::test_float_as_real()",local_158,&local_15c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void test_float_as_real()
{
    variable data(0.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), 0.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), float(data));
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), 0.0);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), double(data));
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), 0.0L);
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), (long double)(data));

    data = std::numeric_limits<float>::min();
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), std::numeric_limits<float>::min());
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), std::numeric_limits<float>::min());
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), std::numeric_limits<float>::min());

    data = std::numeric_limits<float>::max();
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<float>(), std::numeric_limits<float>::max());
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<double>(), std::numeric_limits<float>::max());
    TRIAL_PROTOCOL_TEST_EQUAL(data.value<long double>(), std::numeric_limits<float>::max());
}